

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

wpt_object wpt_init(wave_object wave,int siglength,int J)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  wpt_object pwVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  double dVar14;
  
  if (J < 0x65) {
    iVar2 = wave->filtlength;
    iVar3 = wmaxiter(siglength);
    if (J <= iVar3) {
      iVar11 = 0;
      iVar4 = 0;
      if (0 < J) {
        iVar4 = J;
      }
      iVar5 = 1;
      while (bVar13 = iVar4 != 0, iVar4 = iVar4 + -1, bVar13) {
        iVar11 = iVar11 + iVar5 * 2;
        iVar5 = iVar5 * 2;
      }
      iVar4 = 2;
      iVar10 = 0;
      iVar5 = siglength;
      for (iVar12 = J; 0 < iVar12; iVar12 = iVar12 + -1) {
        dVar14 = ceil((double)(iVar5 + iVar2 + -2) * 0.5);
        iVar5 = (int)dVar14;
        iVar10 = iVar4 * iVar5;
        iVar4 = iVar4 * 2;
      }
      iVar4 = iVar10 + iVar11 * 4;
      uVar6 = iVar4 + J * 2 + 6;
      pwVar7 = (wpt_object)malloc((long)(int)uVar6 * 8 + 0x220);
      pwVar7->outlength = (iVar2 + 1) * (J * 2 + 2) + siglength;
      builtin_strncpy(pwVar7->ext,"sym",4);
      builtin_strncpy(pwVar7->entropy,"shannon",8);
      pwVar7->eparam = 0.0;
      pwVar7->wave = wave;
      pwVar7->siglength = siglength;
      pwVar7->J = J;
      pwVar7->MaxIter = iVar3;
      pwVar7->even = ~siglength & 1;
      pwVar7->cobj = (conv_object)0x0;
      pwVar7->nodes = iVar11;
      pwVar7->lenlength = J + 2;
      pwVar7->output = (double *)(pwVar7 + 1);
      pwVar7->costvalues = (double *)(pwVar7[1].ext + (long)iVar10 * 8 + -0x28);
      pwVar7->basisvector = (double *)(pwVar7[1].ext + (long)(iVar10 + 1 + iVar11) * 8 + -0x28);
      pwVar7->nodeindex = (int *)(pwVar7[1].ext + (long)(iVar10 + 2 + iVar11 * 2) * 8 + -0x28);
      pwVar7->numnodeslevel = (int *)(pwVar7[1].ext + (long)iVar4 * 8 + -8);
      pwVar7->coeflength = (int *)(pwVar7[1].ext + (long)(J + 5 + iVar4) * 8 + -0x28);
      uVar8 = 0;
      uVar9 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar9 = uVar8;
      }
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        pcVar1 = pwVar7[1].ext + uVar8 * 8 + -0x28;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      return pwVar7;
    }
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n");
  }
  else {
    puts("\n The Decomposition Iterations Cannot Exceed 100. Exiting ");
  }
  exit(-1);
}

Assistant:

wpt_object wpt_init(wave_object wave, int siglength, int J) {
	int size, i, MaxIter, temp, nodes,elength,p2,N,lp;
	wpt_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}


	MaxIter = wmaxiter(siglength);
	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n", MaxIter);
		exit(-1);
	}
	temp = 1;
	nodes = 0;
	for (i = 0; i < J; ++i) {
		temp *= 2;
		nodes += temp;
	}

	i = J;
	p2 = 2;
	N = siglength;
	lp = size;
	elength = 0;
	while (i > 0) {
		N = N + lp - 2;
		N = (int)ceil((double)N / 2.0);
		elength = p2 * N;
		i--;
		p2 *= 2;
	}
	//printf("elength %d", elength);

	obj = (wpt_object)malloc(sizeof(struct wpt_set) + sizeof(double)* (elength + 4 * nodes + 2 * J + 6));
	obj->outlength = siglength + 2 * (J + 1) * (size + 1);
	strcpy(obj->ext, "sym");
	strcpy(obj->entropy, "shannon");
	obj->eparam = 0.0;

	obj->wave = wave;
	obj->siglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;
	obj->nodes = nodes;

	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	obj->costvalues = &obj->params[elength];
	obj->basisvector = &obj->params[elength + nodes + 1];
	obj->nodeindex = (int*)&obj->params[elength + 2*nodes + 2];
	obj->numnodeslevel = (int*)&obj->params[elength + 4 * nodes + 4];
	obj->coeflength = (int*)&obj->params[elength + 4 * nodes + J + 5];

	for (i = 0; i < elength + 4 * nodes + 2 * J + 6; ++i) {
		obj->params[i] = 0.0;
	}

	//wave_summary(obj->wave);

	return obj;
}